

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

void __thiscall MinVR::VRDatumFloat::~VRDatumFloat(VRDatumFloat *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>).super_VRDatum_conflict.
  _vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00176b58;
  p_Var2 = (this->super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>).value.
           super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
           _M_next;
  while (p_Var2 != (_List_node_base *)
                   &(this->super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>).value) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  VRDatum::~VRDatum((VRDatum *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

VRDatumFloat(const VRFloat inVal) :
    VRDatumSpecialized<VRFloat, VRCORETYPE_FLOAT>(inVal) {}